

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::IsAnyMessage(Descriptor *descriptor)

{
  bool bVar1;
  string *psVar2;
  FileDescriptor *this;
  bool local_11;
  Descriptor *descriptor_local;
  
  psVar2 = Descriptor::name_abi_cxx11_(descriptor);
  bVar1 = std::operator==(psVar2,"Any");
  local_11 = false;
  if (bVar1) {
    this = Descriptor::file(descriptor);
    psVar2 = FileDescriptor::name_abi_cxx11_(this);
    local_11 = std::operator==(psVar2,"google/protobuf/any.proto");
  }
  return local_11;
}

Assistant:

bool IsAnyMessage(const Descriptor* descriptor) {
  return descriptor->name() == kAnyMessageName &&
         descriptor->file()->name() == kAnyProtoFile;
}